

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name)

{
  _Rb_tree_header *this_00;
  pointer file;
  bool bVar1;
  Type TVar2;
  FileDescriptor *pFVar3;
  _Base_ptr p_Var4;
  DescriptorBuilder *pDVar5;
  _Base_ptr p_Var6;
  DescriptorBuilder *this_01;
  Symbol SVar8;
  Symbol result;
  Symbol local_40;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar7;
  
  SVar8 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name);
  aVar7 = SVar8.field_1;
  TVar2 = SVar8.type;
  if ((TVar2 != NULL_SYMBOL) && (this->pool_->enforce_dependencies_ == true)) {
    local_40.type = TVar2;
    local_40.field_1 = aVar7;
    pFVar3 = anon_unknown_1::Symbol::GetFile(&local_40);
    if (pFVar3 != this->file_) {
      this_00 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &this_00->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(FileDescriptor **)(p_Var6 + 1) < pFVar3]) {
        if (*(FileDescriptor **)(p_Var6 + 1) >= pFVar3) {
          p_Var4 = p_Var6;
        }
      }
      p_Var6 = &this_00->_M_header;
      if (((_Rb_tree_header *)p_Var4 != this_00) &&
         (p_Var6 = p_Var4, pFVar3 < *(FileDescriptor **)(p_Var4 + 1))) {
        p_Var6 = &this_00->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == this_00) {
        if (TVar2 == PACKAGE) {
          this_01 = (DescriptorBuilder *)this_00;
          bVar1 = IsInPackage((DescriptorBuilder *)this_00,this->file_,name);
          if (bVar1) goto LAB_001df2ff;
          for (pDVar5 = (DescriptorBuilder *)
                        (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              pDVar5 != (DescriptorBuilder *)this_00;
              pDVar5 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar5)) {
            file = (pDVar5->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            if ((file != (pointer)0x0) &&
               (bVar1 = IsInPackage(this_01,(FileDescriptor *)file,name), bVar1)) {
              if (pDVar5 != (DescriptorBuilder *)this_00) goto LAB_001df2ff;
              break;
            }
            this_01 = pDVar5;
          }
        }
        this->possible_undeclared_dependency_ = pFVar3;
        std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
        aVar7 = DAT_002975f8;
        TVar2 = (anonymous_namespace)::kNullSymbol;
      }
    }
  }
LAB_001df2ff:
  SVar8._4_4_ = 0;
  SVar8.type = TVar2;
  SVar8.field_1.descriptor = aVar7.descriptor;
  return SVar8;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name) {
  Symbol result = FindSymbolNotEnforcingDeps(name);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader.
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) return result;

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (set<const FileDescriptor*>::const_iterator it = dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}